

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Vec_Int_t * Abc_NtkFindDcLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pLatch;
  int iVar2;
  
  iVar2 = pNtk->nObjCounts[8];
  p = Vec_IntAlloc(iVar2);
  p->nSize = iVar2;
  memset(p->pArray,0,(long)iVar2 << 2);
  for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
    pLatch = Abc_NtkBox(pNtk,iVar2);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      iVar1 = Abc_LatchIsInitDc(pLatch);
      if (iVar1 != 0) {
        Vec_IntWriteEntry(p,iVar2,1);
        Abc_LatchSetInit0(pLatch);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFindDcLatches( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vUnknown;
    Abc_Obj_t * pObj;
    int i;
    vUnknown = Vec_IntStart( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Vec_IntWriteEntry( vUnknown, i, 1 );
            Abc_LatchSetInit0(pObj);
        }
    return vUnknown;
}